

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O1

void __thiscall
cmCTestSVN::LogParser::ReportError(LogParser *this,int param_1,int param_2,char *msg)

{
  ostream *poVar1;
  size_t sVar2;
  
  poVar1 = (this->SVN->super_cmCTestGlobalVC).super_cmCTestVC.Log;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Error parsing svn log xml: ",0x1b);
  if (msg == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)poVar1->_vptr_basic_ostream[-3]);
  }
  else {
    sVar2 = strlen(msg);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,msg,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return;
}

Assistant:

void ReportError(int /*line*/, int /*column*/, const char* msg) override
  {
    this->SVN->Log << "Error parsing svn log xml: " << msg << "\n";
  }